

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O1

OffsetData * QTimeZonePrivate::toOffsetData(OffsetData *__return_storage_ptr__,Data *data)

{
  Data *pDVar1;
  int iVar2;
  long in_FS_OFFSET;
  Data local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (data->abbreviation).d.d;
  (__return_storage_ptr__->abbreviation).d.d = pDVar1;
  (__return_storage_ptr__->abbreviation).d.ptr = (data->abbreviation).d.ptr;
  (__return_storage_ptr__->abbreviation).d.size = (data->abbreviation).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
         );
    UNLOCK();
  }
  local_20 = (Data)0x2;
  QDateTime::fromMSecsSinceEpoch
            (&__return_storage_ptr__->atUtc,data->atMSecsSinceEpoch,(QTimeZone *)&local_20.s);
  iVar2 = data->standardTimeOffset;
  __return_storage_ptr__->offsetFromUtc = data->offsetFromUtc;
  __return_storage_ptr__->standardTimeOffset = iVar2;
  __return_storage_ptr__->daylightTimeOffset = data->daylightTimeOffset;
  QTimeZone::~QTimeZone((QTimeZone *)&local_20.s);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTimeZone::OffsetData QTimeZonePrivate::toOffsetData(const QTimeZonePrivate::Data &data)
{
    if (data.atMSecsSinceEpoch == invalidMSecs())
        return invalidOffsetData();

    return {
        data.abbreviation,
        QDateTime::fromMSecsSinceEpoch(data.atMSecsSinceEpoch, QTimeZone::UTC),
        data.offsetFromUtc, data.standardTimeOffset, data.daylightTimeOffset };
}